

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetModifiedTxByHandle(void *handle,void *tx_data_handle,char **tx_hex_string)

{
  AbstractTransaction *this;
  char *pcVar1;
  CfdException *pCVar2;
  bool is_bitcoin;
  allocator local_69;
  string local_68;
  string base_tx;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&base_tx,"TransactionData",(allocator *)&local_68);
  cfd::capi::CheckBuffer(tx_data_handle,&base_tx);
  std::__cxx11::string::~string((string *)&base_tx);
  if (tx_hex_string == (char **)0x0) {
    base_tx._M_dataplus._M_p = "cfdcapi_transaction.cpp";
    base_tx._M_string_length = CONCAT44(base_tx._M_string_length._4_4_,0xde5);
    base_tx.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7f816c;
    cfd::core::logger::warn<>((CfdSourceLocation *)&base_tx,"tx hex string is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&base_tx,"Failed to parameter. tx hex string is null.",
               (allocator *)&local_68);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&base_tx);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  base_tx._M_dataplus._M_p = (pointer)&base_tx.field_2;
  base_tx._M_string_length = 0;
  base_tx.field_2._M_allocated_capacity = base_tx.field_2._M_allocated_capacity & 0xffffffffffffff00
  ;
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  this = *(AbstractTransaction **)((long)tx_data_handle + 0x18);
  if (this != (AbstractTransaction *)0x0) {
    if (is_bitcoin == true) {
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_68,this);
      pcVar1 = cfd::capi::CreateString(&local_68);
    }
    else {
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_68,this);
      pcVar1 = cfd::capi::CreateString(&local_68);
    }
    *tx_hex_string = pcVar1;
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&base_tx);
    return 0;
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_68,"Invalid handle state. tx is null",&local_69);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_68);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetModifiedTxByHandle(
    void* handle, void* tx_data_handle, char** tx_hex_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    if (tx_hex_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx hex string is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx hex string is null.");
    }

    std::string base_tx;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      *tx_hex_string = CreateString(tx->GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      *tx_hex_string = CreateString(tx->GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}